

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O1

int Llb_ManComputeCommonQuant(Llb_Mtr_t *p,int iCol1,int iCol2)

{
  char **ppcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = p->nRows - p->nFfs;
  if (uVar2 == 0 || p->nRows < p->nFfs) {
    return 0;
  }
  ppcVar1 = p->pMatrix;
  uVar4 = 0;
  iVar3 = 0;
  do {
    if (ppcVar1[iCol1][uVar4] == '\x01') {
      if ((ppcVar1[iCol2][uVar4] != '\x01') || (p->pRowSums[uVar4] != 2)) {
        if (ppcVar1[iCol2][uVar4] != '\0') goto LAB_009228f0;
        goto LAB_00922900;
      }
      iVar3 = iVar3 + 2;
    }
    else {
LAB_009228f0:
      if ((ppcVar1[iCol1][uVar4] == '\0') && (ppcVar1[iCol2][uVar4] == '\x01')) {
LAB_00922900:
        iVar3 = iVar3 + -1;
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar2 == uVar4) {
      return iVar3;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManComputeCommonQuant( Llb_Mtr_t * p, int iCol1, int iCol2 )
{
    int iVar, Weight = 0;
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    {
        // count each removed variable as 2
        if ( p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 1 && p->pRowSums[iVar] == 2 )
            Weight += 2;
        // count each added variale as -1
        else if ( (p->pMatrix[iCol1][iVar] == 1 && p->pMatrix[iCol2][iVar] == 0) || 
                  (p->pMatrix[iCol1][iVar] == 0 && p->pMatrix[iCol2][iVar] == 1) )
            Weight--;
    }
    return Weight;
}